

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

Wlc_Ntk_t * Wla_ManCreateAbs(Wla_Man_t *pWla)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *__dest;
  Wlc_Ntk_t *pWVar4;
  Vec_Int_t **extraout_RDX;
  Vec_Int_t **extraout_RDX_00;
  Vec_Int_t **pvFlops;
  long lVar5;
  
  if (pWla->vBlacks == (Vec_Int_t *)0x0) {
    pVVar2 = Wlc_NtkGetBlacks(pWla->p,pWla->pPars);
    pWla->vBlacks = pVVar2;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar1 = pVVar2->nSize;
    lVar5 = (long)iVar1;
    pVVar3->nSize = iVar1;
    pVVar3->nCap = iVar1;
    if (lVar5 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar5 * 4);
    }
    pVVar3->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar5 << 2);
    pWla->vSignals = pVVar3;
    pvFlops = extraout_RDX_00;
  }
  else {
    Wlc_NtkUpdateBlacks(pWla->p,pWla->pPars,&pWla->vBlacks,pWla->vUnmark,pWla->vSignals);
    pvFlops = extraout_RDX;
  }
  pWVar4 = Wlc_NtkAbs2(pWla->p,pWla->vBlacks,pvFlops);
  return pWVar4;
}

Assistant:

Wlc_Ntk_t * Wla_ManCreateAbs( Wla_Man_t * pWla )
{
    Wlc_Ntk_t * pAbs;

    // get abstracted GIA and the set of pseudo-PIs (vBlacks)
    if ( pWla->vBlacks == NULL )
    {
        pWla->vBlacks = Wlc_NtkGetBlacks( pWla->p, pWla->pPars );
        pWla->vSignals = Vec_IntDup( pWla->vBlacks );
    }
    else
    {
        Wlc_NtkUpdateBlacks( pWla->p, pWla->pPars, &pWla->vBlacks, pWla->vUnmark, pWla->vSignals );
    }
    pAbs = Wlc_NtkAbs2( pWla->p, pWla->vBlacks, NULL );

    return pAbs;
}